

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int set_file_encryption(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  char *pcVar3;
  ushort uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  pcVar3 = argv[1];
  iVar1 = strcasecmp(pcVar3,"none");
  if (iVar1 == 0) {
    uVar4 = 0;
  }
  else {
    iVar1 = strcasecmp(pcVar3,"PKWARE");
    if (iVar1 == 0) {
      uVar4 = 1;
    }
    else {
      iVar1 = strcasecmp(pcVar3,"AES-128");
      if (iVar1 == 0) {
        uVar4 = 0x101;
      }
      else {
        iVar1 = strcasecmp(pcVar3,"AES-192");
        if (iVar1 == 0) {
          uVar4 = 0x102;
        }
        else {
          iVar1 = strcasecmp(pcVar3,"AES-256");
          if (iVar1 == 0) {
            uVar4 = 0x103;
          }
          else {
            iVar1 = strcasecmp(pcVar3,"unknown");
            uVar4 = -(ushort)(iVar1 != 0) | 100;
          }
        }
      }
    }
  }
  pcVar3 = (char *)0x0;
  if (*argv[2] != '\0') {
    pcVar3 = argv[2];
  }
  iVar1 = zip_file_set_encryption(za,uVar2,uVar4,pcVar3);
  if (iVar1 < 0) {
    set_file_encryption_cold_1();
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int
set_file_encryption(int argc, char *argv[]) {
    zip_uint16_t method;
    zip_uint64_t idx;
    char *password;
    idx = strtoull(argv[0], NULL, 10);
    method = get_encryption_method(argv[1]);
    password = argv[2];
    if (strlen(password) == 0) {
	password = NULL;
    }
    if (zip_file_set_encryption(za, idx, method, password) < 0) {
	fprintf(stderr, "can't set file encryption method at index '%" PRIu64 "' to '%s': %s\n", idx, argv[1], zip_strerror(za));
	return -1;
    }
    return 0;
}